

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double beta_cdf(double x,double a,double b)

{
  undefined8 local_28;
  double cdf;
  double b_local;
  double a_local;
  double x_local;
  
  if (0.0 < x) {
    if (1.0 < x) {
      local_28 = 1.0;
    }
    else {
      local_28 = beta_inc(a,b,x);
    }
  }
  else {
    local_28 = 0.0;
  }
  return local_28;
}

Assistant:

double beta_cdf ( double x, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    BETA_CDF evaluates the Beta CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the CDF.
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < A,
//    0.0 < B.
//
//    Output, double BETA_CDF, the value of the CDF.
//
{
  double cdf;

  if ( x <= 0.0 )
  {
    cdf = 0.0;
  }
  else if ( x <= 1.0 )
  {
    cdf = beta_inc ( a, b, x );
  }
  else
  {
    cdf = 1.0;
  }

  return cdf;
}